

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall
Js::CompoundString::CompoundString
          (CompoundString *this,CharCount initialBlockSize,bool allocateBlock,
          JavascriptLibrary *library)

{
  Type *this_00;
  Block *pBVar1;
  code *pcVar2;
  bool bVar3;
  StaticType *type;
  undefined4 *puVar4;
  Block *pBVar5;
  undefined7 in_register_00000011;
  
  type = StringCache::GetStringTypeStatic(&library->stringCache);
  LiteralString::LiteralString(&this->super_LiteralString,type);
  (this->super_LiteralString).super_JavascriptString.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01508098;
  this_00 = &this->lastBlockInfo;
  BlockInfo::BlockInfo(this_00);
  this->directCharLength = 0xffffffff;
  this->ownsLastBlock = true;
  (this->lastBlock).ptr = (Block *)0x0;
  if ((int)CONCAT71(in_register_00000011,allocateBlock) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1d9,"(allocateBlock)","allocateBlock");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pBVar5 = Block::New(initialBlockSize,(Block *)0x0,library->recycler);
  pBVar1 = (pBVar5->bufferOwner).ptr;
  Memory::Recycler::WBSetBit((char *)this_00);
  (this->lastBlockInfo).buffer.ptr = pBVar1 + 1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this_00);
  (this->lastBlockInfo).charLength = pBVar5->charLength;
  (this->lastBlockInfo).charCapacity = pBVar5->charCapacity;
  Memory::Recycler::WBSetBit((char *)&this->lastBlock);
  (this->lastBlock).ptr = pBVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastBlock);
  return;
}

Assistant:

CompoundString::CompoundString(
        const CharCount initialBlockSize,
        const bool allocateBlock,
        JavascriptLibrary *const library)
        : LiteralString(library->GetStringTypeStatic()),
        directCharLength(static_cast<CharCount>(-1)),
        ownsLastBlock(true)
    {
        Assert(allocateBlock);
        Assert(library);

        Block *const block = Block::New(initialBlockSize, nullptr, library->GetRecycler());
        lastBlockInfo.CopyFrom(block);
        lastBlock = block;
    }